

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::ResetCords_ReadLargeCord_Test::~ResetCords_ReadLargeCord_Test
          (ResetCords_ReadLargeCord_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ResetCords, ReadLargeCord) {
  bool kResetCords_case = GetParam();
  absl::Cord large_cord;
  for (int i = 0; i < 1024; i++) {
    large_cord.Append(kRawBytes);
  }
  CordInputStream input(&large_cord);

  {
    CodedInputStream coded_input(&input);

    absl::Cord cord;
    if (!kResetCords_case) cord.Append(absl::string_view("value"));
    EXPECT_TRUE(
        coded_input.ReadCord(&cord, static_cast<int>(large_cord.size())));
    EXPECT_EQ(large_cord, cord);
  }

  EXPECT_EQ(large_cord.size(), input.ByteCount());
}